

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code.cpp
# Opt level: O2

Code * __thiscall md::Code::andi(Code *this,ImmediateValue *value,Param *target,Size size)

{
  uint16_t uVar1;
  short sVar2;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_40;
  
  sVar2 = 0x240;
  if (size != WORD) {
    sVar2 = (size == LONG | 4) << 7;
  }
  uVar1 = Param::getMXn(target);
  add_word(this,uVar1 + sVar2);
  (*(value->super_Param)._vptr_Param[2])(&local_40,value);
  add_bytes(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  (*target->_vptr_Param[2])(&local_40,target);
  add_bytes(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_40);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_40);
  return this;
}

Assistant:

Code& Code::andi(const ImmediateValue& value, const Param& target, Size size)
{
    uint16_t size_code = 0x0;
    if (size == Size::WORD)
        size_code = 0x1;
    else if (size == Size::LONG)
        size_code = 0x2;

    uint16_t opcode = 0x0200 + (size_code << 6) + target.getMXn();
    this->add_opcode(opcode);
    this->add_bytes(value.getAdditionnalData());
    this->add_bytes(target.getAdditionnalData());

    return *this;
}